

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::Open
          (GeneratorResponseContext *this,string *filename)

{
  CodeGeneratorResponse_File *this_00;
  uint32_t *puVar1;
  Arena *arena;
  StringOutputStream *this_01;
  string *target;
  File *file;
  string *filename_local;
  GeneratorResponseContext *this_local;
  
  this_00 = CodeGeneratorResponse::add_file(this->response_);
  puVar1 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  arena = MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,filename,arena);
  this_01 = (StringOutputStream *)operator_new(0x10);
  target = CodeGeneratorResponse_File::mutable_content_abi_cxx11_(this_00);
  io::StringOutputStream::StringOutputStream(this_01,target);
  return &this_01->super_ZeroCopyOutputStream;
}

Assistant:

io::ZeroCopyOutputStream* Open(const std::string& filename) override {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    return new io::StringOutputStream(file->mutable_content());
  }